

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

void __thiscall
Hpipe::Instruction::get_unused_rec
          (Instruction *this,Vec<Hpipe::Instruction_*> *to_remove,Instruction **init)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  Transition *pTVar4;
  reference pTVar5;
  Transition *t;
  iterator __end1;
  iterator __begin1;
  Vec<Hpipe::Transition> *__range1;
  Instruction *local_28;
  Instruction **local_20;
  Instruction **init_local;
  Vec<Hpipe::Instruction_*> *to_remove_local;
  Instruction *this_local;
  
  if (this->op_id != cur_op_id) {
    this->op_id = cur_op_id;
    local_20 = init;
    init_local = (Instruction **)to_remove;
    to_remove_local = (Vec<Hpipe::Instruction_*> *)this;
    uVar2 = (*this->_vptr_Instruction[0xb])();
    if ((uVar2 & 1) != 0) {
      if (this == *local_20) {
        sVar3 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::size
                          (&(this->next).
                            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
        if (sVar3 == 1) {
          pTVar4 = Vec<Hpipe::Transition>::operator[](&this->next,0);
          *local_20 = pTVar4->inst;
          local_28 = this;
          Vec<Hpipe::Instruction_*>::operator<<((Vec<Hpipe::Instruction_*> *)init_local,&local_28);
        }
      }
      else {
        __range1 = (Vec<Hpipe::Transition> *)this;
        Vec<Hpipe::Instruction_*>::operator<<
                  ((Vec<Hpipe::Instruction_*> *)init_local,(Instruction **)&__range1);
      }
    }
    __end1 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::begin
                       (&(this->next).
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
    t = (Transition *)
        std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::end
                  (&(this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                  );
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                                       *)&t), bVar1) {
      pTVar5 = __gnu_cxx::
               __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
               ::operator*(&__end1);
      (*pTVar5->inst->_vptr_Instruction[8])(pTVar5->inst,init_local,local_20);
      __gnu_cxx::
      __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void Instruction::get_unused_rec( Vec<Instruction *> &to_remove, Instruction *&init ) {
    if ( op_id == Instruction::cur_op_id )
        return;
    op_id = Instruction::cur_op_id;

    if ( can_be_deleted() ) {
        if ( this == init ) {
            if ( next.size() == 1 ) {
                init = next[ 0 ].inst;
                to_remove << this;
            }
        } else
            to_remove << this;
    }

    for( Transition &t : next )
        t.inst->get_unused_rec( to_remove, init );
}